

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O1

duckdb_aggregate_function duckdb_create_aggregate_function(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  AggregateFunction *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  AggregateFunctionInfo *__tmp;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_68;
  LogicalType local_50;
  string local_38;
  
  this_00 = (AggregateFunction *)operator_new(0x130);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38);
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duckdb::LogicalType::LogicalType(&local_50,INVALID);
  duckdb::AggregateFunction::AggregateFunction
            (this_00,&local_38,(vector<duckdb::LogicalType,_true> *)&local_68,&local_50,
             duckdb::CAPIAggregateStateSize,duckdb::CAPIAggregateStateInit,
             duckdb::CAPIAggregateUpdate,duckdb::CAPIAggregateCombine,duckdb::CAPIAggregateFinalize,
             (aggregate_simple_update_t)0x0,duckdb::CAPIAggregateBind,(aggregate_destructor_t)0x0,
             (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  duckdb::LogicalType::~LogicalType(&local_50);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_024abc10;
  this_01[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[1]._M_use_count = 0;
  this_01[1]._M_weak_count = 0;
  this_01[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[4]._M_use_count = 0;
  this_01[4]._M_weak_count = 0;
  this_01[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[3]._M_use_count = 0;
  this_01[3]._M_weak_count = 0;
  this_01[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[2]._M_use_count = 0;
  this_01[2]._M_weak_count = 0;
  this_01[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[1]._vptr__Sp_counted_base = (_func_int **)&PTR__CAggregateFunctionInfo_024abc60;
  this_01[4]._M_use_count = 0;
  this_01[4]._M_weak_count = 0;
  this_01[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[3]._M_use_count = 0;
  this_01[3]._M_weak_count = 0;
  this_01[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[2]._M_use_count = 0;
  this_01[2]._M_weak_count = 0;
  this_01[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[1]._M_use_count = 0;
  this_01[1]._M_weak_count = 0;
  this_01[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_01->_M_use_count = this_01->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_01->_M_use_count = 2;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  (this_00->function_info).internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(this_01 + 1);
  this = (this_00->function_info).internal.
         super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
  (this_00->function_info).internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       this_01;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return (duckdb_aggregate_function)this_00;
}

Assistant:

duckdb_aggregate_function duckdb_create_aggregate_function() {
	auto function = new duckdb::AggregateFunction("", {}, duckdb::LogicalType::INVALID, duckdb::CAPIAggregateStateSize,
	                                              duckdb::CAPIAggregateStateInit, duckdb::CAPIAggregateUpdate,
	                                              duckdb::CAPIAggregateCombine, duckdb::CAPIAggregateFinalize, nullptr,
	                                              duckdb::CAPIAggregateBind);
	function->function_info = duckdb::make_shared_ptr<duckdb::CAggregateFunctionInfo>();
	return reinterpret_cast<duckdb_aggregate_function>(function);
}